

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# KktChStep.cpp
# Opt level: O0

void __thiscall KktChStep::printA(KktChStep *this)

{
  bool bVar1;
  _Setw _Var2;
  reference pvVar3;
  ostream *poVar4;
  reference pvVar5;
  long in_RDI;
  int i_3;
  int i_2;
  int ind;
  int j;
  int i_1;
  int i;
  char buff [4];
  int local_38;
  int local_30;
  int local_20;
  int local_1c;
  int local_18;
  int local_10;
  char local_c [12];
  
  std::operator<<((ostream *)&std::cout,"\n-----cost-----\n");
  for (local_10 = 0; local_10 < *(int *)(in_RDI + 0xf8); local_10 = local_10 + 1) {
    pvVar3 = std::vector<double,_std::allocator<double>_>::operator[]
                       ((vector<double,_std::allocator<double>_> *)(in_RDI + 0x148),(long)local_10);
    sprintf(local_c,"%2.1g ",*pvVar3);
    _Var2 = std::setw(5);
    poVar4 = std::operator<<((ostream *)&std::cout,_Var2);
    std::operator<<(poVar4,local_c);
  }
  std::ostream::operator<<((ostream *)&std::cout,std::endl<char,std::char_traits<char>>);
  std::operator<<((ostream *)&std::cout,"------A-|-b-----\n");
  local_18 = 0;
  do {
    if (*(int *)(in_RDI + 0xfc) <= local_18) {
      std::operator<<((ostream *)&std::cout,"------l------\n");
      for (local_30 = 0; local_30 < *(int *)(in_RDI + 0xf8); local_30 = local_30 + 1) {
        pvVar3 = std::vector<double,_std::allocator<double>_>::operator[]
                           ((vector<double,_std::allocator<double>_> *)(in_RDI + 0x160),
                            (long)local_30);
        if (*pvVar3 <= -1e+200) {
          sprintf(local_c,"-inf");
        }
        else {
          pvVar3 = std::vector<double,_std::allocator<double>_>::operator[]
                             ((vector<double,_std::allocator<double>_> *)(in_RDI + 0x160),
                              (long)local_30);
          sprintf(local_c,"%2.1g ",*pvVar3);
        }
        _Var2 = std::setw(5);
        poVar4 = std::operator<<((ostream *)&std::cout,_Var2);
        std::operator<<(poVar4,local_c);
      }
      std::ostream::operator<<((ostream *)&std::cout,std::endl<char,std::char_traits<char>>);
      std::operator<<((ostream *)&std::cout,"------u------\n");
      for (local_38 = 0; local_38 < *(int *)(in_RDI + 0xf8); local_38 = local_38 + 1) {
        pvVar3 = std::vector<double,_std::allocator<double>_>::operator[]
                           ((vector<double,_std::allocator<double>_> *)(in_RDI + 0x178),
                            (long)local_38);
        if (1e+200 < *pvVar3 || *pvVar3 == 1e+200) {
          sprintf(local_c,"inf");
        }
        else {
          pvVar3 = std::vector<double,_std::allocator<double>_>::operator[]
                             ((vector<double,_std::allocator<double>_> *)(in_RDI + 0x178),
                              (long)local_38);
          sprintf(local_c,"%2.1g ",*pvVar3);
        }
        _Var2 = std::setw(5);
        poVar4 = std::operator<<((ostream *)&std::cout,_Var2);
        std::operator<<(poVar4,local_c);
      }
      std::ostream::operator<<((ostream *)&std::cout,std::endl<char,std::char_traits<char>>);
      return;
    }
    for (local_1c = 0; local_1c < *(int *)(in_RDI + 0xf8); local_1c = local_1c + 1) {
      pvVar5 = std::vector<int,_std::allocator<int>_>::operator[]
                         ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x100),(long)local_1c);
      local_20 = *pvVar5;
      while( true ) {
        pvVar5 = std::vector<int,_std::allocator<int>_>::operator[]
                           ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x118),(long)local_20);
        bVar1 = false;
        if (*pvVar5 != local_18) {
          pvVar5 = std::vector<int,_std::allocator<int>_>::operator[]
                             ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x100),
                              (long)(local_1c + 1));
          bVar1 = local_20 < *pvVar5;
        }
        if (!bVar1) break;
        local_20 = local_20 + 1;
      }
      pvVar5 = std::vector<int,_std::allocator<int>_>::operator[]
                         ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x118),(long)local_20);
      if (*pvVar5 == local_18) {
        pvVar5 = std::vector<int,_std::allocator<int>_>::operator[]
                           ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x100),
                            (long)(local_1c + 1));
        if (*pvVar5 <= local_20) goto LAB_001c3f89;
        pvVar3 = std::vector<double,_std::allocator<double>_>::operator[]
                           ((vector<double,_std::allocator<double>_> *)(in_RDI + 0x130),
                            (long)local_20);
        sprintf(local_c,"%2.1g ",*pvVar3);
        _Var2 = std::setw(5);
        poVar4 = std::operator<<((ostream *)&std::cout,_Var2);
        std::operator<<(poVar4,local_c);
      }
      else {
LAB_001c3f89:
        _Var2 = std::setw(5);
        poVar4 = std::operator<<((ostream *)&std::cout,_Var2);
        std::operator<<(poVar4,"   ");
      }
    }
    poVar4 = std::operator<<((ostream *)&std::cout,"  |   ");
    _Var2 = std::setw(5);
    poVar4 = std::operator<<(poVar4,_Var2);
    pvVar3 = std::vector<double,_std::allocator<double>_>::operator[]
                       ((vector<double,_std::allocator<double>_> *)(in_RDI + 0x98),(long)local_18);
    poVar4 = (ostream *)std::ostream::operator<<(poVar4,*pvVar3);
    poVar4 = std::operator<<(poVar4," < < ");
    pvVar3 = std::vector<double,_std::allocator<double>_>::operator[]
                       ((vector<double,_std::allocator<double>_> *)(in_RDI + 0xb0),(long)local_18);
    poVar4 = (ostream *)std::ostream::operator<<(poVar4,*pvVar3);
    std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
    local_18 = local_18 + 1;
  } while( true );
}

Assistant:

void KktChStep::printA() {
	char buff [4];
	cout<<"\n-----cost-----\n";

	for (int i=0;i<numCol;i++) {
		sprintf(buff, "%2.1g ", colCost[i]);
		cout<<std::setw(5)<<buff; 
	}
	cout<<endl;
	cout<<"------A-|-b-----\n";
	for (int i=0;i<numRow;i++) {
		for (int j=0;j<numCol;j++) {

			int ind = Astart[j];
			while (Aindex[ind]!=i && ind<Astart[j+1]) 
				ind++;
			//if a_ij is nonzero print
			if (Aindex[ind]==i && ind<Astart[j+1])
			{	
				sprintf(buff, "%2.1g ", Avalue[ind]);
				cout<<std::setw(5)<<buff; 
				}
			else cout<<std::setw(5)<<"   ";
			
		}
		cout<<"  |   "<<std::setw(5)<<RrowLower[i]<<" < < "<<RrowUpper[i]<<endl;
	}
	cout<<"------l------\n";
	for (int i=0;i<numCol;i++) {
		if (colLower[i]>-HSOL_CONST_INF)
			sprintf(buff, "%2.1g ", colLower[i]);
		else 
			sprintf(buff, "-inf");
		cout<<setw(5)<<buff; 
	}
	cout<<endl;
	cout<<"------u------\n";
	for (int i=0;i<numCol;i++) {
		if (colUpper[i]<HSOL_CONST_INF)
			sprintf(buff, "%2.1g ", colUpper[i]);
		else 
			sprintf(buff, "inf");
		cout<<setw(5)<<buff; 
	}
	cout<<endl;

}